

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_parseQuery
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  char *__s;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  undefined4 in_register_00000034;
  int in_R8D;
  
  if (getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar6 != 0) {
      getp_parseQuery::desc.min_argc_ = 0;
      getp_parseQuery::desc.opt_argc_ = 0;
      getp_parseQuery::desc.varargs_ = 0;
      __cxa_guard_release(&getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&getp_parseQuery::desc);
  if (iVar6 == 0) {
    __s = *(char **)(*(long *)(*(long *)(this->super_CVmObject).ext_ + 0x48) + 0x10);
    sVar8 = strlen(__s);
    vVar7 = CVmObjLookupTable::create(0,0x10,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    uVar1 = (retval->val).obj;
    pCVar2 = G_obj_table_X.pages_[uVar1 >> 0xc];
    pcVar9 = strchr(__s,0x3f);
    pcVar10 = __s + sVar8;
    if (pcVar9 != (char *)0x0) {
      pcVar10 = pcVar9;
    }
    add_parsed_val((CVmObjLookupTable *)(pCVar2 + (uVar1 & 0xfff)),(int)__s,pcVar10 + -(long)__s,1,
                   in_R8D);
    if (*pcVar10 == '?') {
      parse_query_params((CVmObjLookupTable *)(pCVar2 + (uVar1 & 0xfff)),pcVar10 + 1,1);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_parseQuery(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the query string from the request */
    TadsHttpRequest *req = get_ext()->req;
    const char *q = req->resource_name->get();
    size_t ql = strlen(q);

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 16, 32));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   the resource name is the part of the query up to the first '?', or
     *   the entire string if there's no '?' 
     */
    const char *qq = strchr(q, '?');
    if (qq == 0)
        qq = q + ql;

    /* add the resource name under key [1] */
    add_parsed_val(vmg_ tab, 1, q, qq - q, ENCMODE_URL);

    /* parse the query parameters, starting after the '?' */
    if (*qq == '?')
        parse_query_params(vmg_ tab, qq + 1, ENCMODE_URL);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}